

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
GrowAndEmplaceBack<S2ShapeIndexCell_const*>
          (InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *this,
          S2ShapeIndexCell **args)

{
  ulong uVar1;
  ulong uVar2;
  pointer ppSVar3;
  InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *pIVar4;
  ulong uVar5;
  long lVar6;
  Allocation new_allocation;
  
  uVar1 = *(ulong *)this;
  uVar5 = uVar1 >> 1;
  if ((uVar1 & 1) == 0) {
    uVar2 = 6;
  }
  else {
    uVar2 = *(ulong *)(this + 8);
  }
  if (uVar5 == uVar2) {
    ppSVar3 = std::allocator_traits<std::allocator<const_S2ShapeIndexCell_*>_>::allocate
                        ((allocator_type *)this,uVar1 & 0xfffffffffffffffe);
    ppSVar3[uVar5] = *args;
    if (((byte)*this & 1) == 0) {
      pIVar4 = this + 8;
    }
    else {
      pIVar4 = *(InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>
                 **)(this + 0x10);
    }
    for (lVar6 = 0; uVar5 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)ppSVar3 + lVar6) = *(undefined8 *)(pIVar4 + lVar6);
    }
    new_allocation.buffer_ = ppSVar3;
    new_allocation.capacity_ = uVar1 & 0xfffffffffffffffe;
    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
    ResetAllocation((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                     *)this,new_allocation,uVar5 + 1);
    return ppSVar3 + uVar5;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::GrowAndEmplaceBack(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }